

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O3

void __thiscall Am_Image_Array::Get_Size(Am_Image_Array *this,int *ret_width,int *ret_height)

{
  ushort uVar1;
  Am_Image_Array_Data *this_00;
  bool bVar2;
  Am_Generic_Image *pAVar3;
  
  *ret_height = 0;
  *ret_width = 0;
  this_00 = this->data;
  if (this_00 != (Am_Image_Array_Data *)0x0) {
    pAVar3 = this_00->image_;
    if (pAVar3 == (Am_Generic_Image *)0x0) {
      bVar2 = Am_Image_Array_Data::make_generic_image_from_name(this_00);
      if (!bVar2) {
        return;
      }
      pAVar3 = this->data->image_;
    }
    uVar1 = (pAVar3->iminfo).height;
    *ret_width = (uint)(pAVar3->iminfo).width;
    *ret_height = (uint)uVar1;
  }
  return;
}

Assistant:

void
Am_Image_Array::Get_Size(int &ret_width, int &ret_height) const
{
  ret_width = ret_height = 0;
  if (data) {
    if (data->image_ == nullptr) {
      if (!data->make_generic_image_from_name())
        return;
    }
    short unsigned int w, h; // using temps explicitly gets rid of a warning
    data->image_->Get_Size(w, h);
    ret_width = w;
    ret_height = h;
  }
}